

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::type_caster_generic::src_and_type
          (void *src,type_info *cast_type,type_info *rtti_type)

{
  type_info *ptVar1;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar2;
  undefined1 local_68 [8];
  string tname;
  string msg;
  
  local_68 = (undefined1  [8])cast_type;
  ptVar1 = get_type_info((type_index *)local_68,false);
  if (ptVar1 == (type_info *)0x0) {
    if (rtti_type != (type_info *)0x0) {
      cast_type = rtti_type;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,*(char **)(cast_type + 8) + (**(char **)(cast_type + 8) == '*'),
               (allocator<char> *)(tname.field_2._M_local_buf + 8));
    clean_type_id((string *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tname.field_2 + 8),"Unregistered type : ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    PyErr_SetString(_PyExc_TypeError,tname.field_2._8_8_);
    std::__cxx11::string::~string((string *)(tname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_68);
    src = (void *)0x0;
  }
  pVar2.second = ptVar1;
  pVar2.first = src;
  return pVar2;
}

Assistant:

PYBIND11_NOINLINE static std::pair<const void *, const type_info *> src_and_type(
            const void *src, const std::type_info &cast_type, const std::type_info *rtti_type = nullptr) {
        if (auto *tpi = get_type_info(cast_type))
            return {src, const_cast<const type_info *>(tpi)};

        // Not found, set error:
        std::string tname = rtti_type ? rtti_type->name() : cast_type.name();
        detail::clean_type_id(tname);
        std::string msg = "Unregistered type : " + tname;
        PyErr_SetString(PyExc_TypeError, msg.c_str());
        return {nullptr, nullptr};
    }